

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

void __thiscall
capnp::LocalRequest::LocalRequest
          (LocalRequest *this,uint64_t interfaceId,uint16_t methodId,
          Maybe<capnp::MessageSize> *sizeHint,Own<capnp::ClientHook> *client)

{
  ClientHook *pCVar1;
  uint local_24;
  
  (this->super_RequestHook)._vptr_RequestHook = (_func_int **)&PTR_send_0066d958;
  kj::heap<capnp::MallocMessageBuilder,unsigned_int>((kj *)&this->message,&local_24);
  this->interfaceId = interfaceId;
  this->methodId = methodId;
  pCVar1 = client->ptr;
  (this->client).disposer = client->disposer;
  (this->client).ptr = pCVar1;
  client->ptr = (ClientHook *)0x0;
  return;
}

Assistant:

inline LocalRequest(uint64_t interfaceId, uint16_t methodId,
                      kj::Maybe<MessageSize> sizeHint, kj::Own<ClientHook> client)
      : message(kj::heap<MallocMessageBuilder>(firstSegmentSize(sizeHint))),
        interfaceId(interfaceId), methodId(methodId), client(kj::mv(client)) {}